

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  vector<int,_std::allocator<int>_> test;
  function<double_(int)> func;
  vector<double,_std::allocator<double>_> output;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  vector<double,_std::allocator<double>_> expectedMap;
  
  local_58._M_unused._M_object = (void *)0x300000001;
  local_58._8_8_ = 0x3200000022;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&test,__l,(allocator_type *)&func);
  poVar2 = std::operator<<((ostream *)&std::cout,"Test map...");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_48 = 0x4051000000000000;
  uStack_40 = 0x4059000000000000;
  local_58._M_unused._M_member_pointer = 0x4000000000000000;
  local_58._8_8_ = 0x4018000000000000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&expectedMap,__l_00,(allocator_type *)&func);
  func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  func.super__Function_base._M_functor._8_8_ = 0;
  func._M_invoker =
       std::
       _Function_handler<double_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/map/main.cpp:18:33)>
       ::_M_invoke;
  func.super__Function_base._M_manager =
       std::
       _Function_handler<double_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/map/main.cpp:18:33)>
       ::_M_manager;
  std::vector<double,_std::allocator<double>_>::vector
            (&output,(long)test.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)test.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2,
             (allocator_type *)local_58._M_pod_data);
  std::function<double_(int)>::function((function<double_(int)> *)&local_58,&func);
  std::
  transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::function<double(int)>>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      test.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,(function<double_(int)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  bVar1 = std::operator==(&expectedMap,&output);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&output.super__Vector_base<double,_std::allocator<double>_>);
    std::_Function_base::~_Function_base(&func.super__Function_base);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&expectedMap.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&test.super__Vector_base<int,_std::allocator<int>_>);
    return 0;
  }
  __assert_fail("expectedMap==output",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/map/main.cpp"
                ,0x14,"int main()");
}

Assistant:

int main(){

    
  
  vector<int> test={1, 3, 34, 50};
  
  cout << "Test map..." << endl;
  vector<double> expectedMap={2, 6, 68, 100};
  function< double(int) > func= [] (const int & element){return 2.0*element;};   
  vector<double> output= Functional::map( test,  func );
  assert(expectedMap==output);
  cout << "passed!" << endl;
 
  return 0;

}